

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_bless(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  int in_R8D;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  if (in_R8D == 1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else if ((in_RCX->position == 7) || (bVar1 = is_affected(in_RCX,in_EDI), bVar1)) {
    if (in_RCX == in_RDX) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          in_stack_ffffffffffffff68,0);
    }
  }
  else {
    init_affect((AFFECT_DATA *)0x612346);
    affect_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    affect_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (in_RDX != in_RCX) {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          in_stack_ffffffffffffff68,0);
    }
  }
  return;
}

Assistant:

void spell_bless(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	AFFECT_DATA af;

	if (target == TARGET_OBJ)
	{
		send_to_char("Uh, what are you thinking?\n\r", ch);
		return;
	}

	/* character target */
	victim = (CHAR_DATA *)vo;

	if (victim->position == POS_FIGHTING || is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already blessed.\n\r", ch);
		else
			act("$N already has divine favor.", ch, nullptr, victim, TO_CHAR);

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.level = level;
	af.duration = 6 + level;
	af.location = APPLY_HITROLL;
	af.aftype = AFT_COMMUNE;

	if (level < 8)
		af.modifier = 1;
	else
		af.modifier = level / 8;

	affect_to_char(victim, &af);

	af.location = APPLY_SAVING_SPELL;

	if (level < 8)
		af.modifier = -1;
	else
		af.modifier = 0 - level / 8;

	affect_to_char(victim, &af);
	send_to_char("You feel righteous.\n\r", victim);

	if (ch != victim)
		act("You grant $N the favor of your god.", ch, nullptr, victim, TO_CHAR);
}